

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O0

descriptor_state *
asio::detail::object_pool_access::create<asio::detail::epoll_reactor::descriptor_state>(void)

{
  descriptor_state *pdVar1;
  descriptor_state *in_stack_00000030;
  
  pdVar1 = (descriptor_state *)operator_new(0x98);
  epoll_reactor::descriptor_state::descriptor_state(in_stack_00000030);
  return pdVar1;
}

Assistant:

static Object* create()
  {
    return new Object;
  }